

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

cTValue * lj_meta_lookup(lua_State *L,cTValue *o,MMS mm)

{
  undefined8 *puVar1;
  cTValue *pcVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = o->it64 >> 0x2f;
  if ((uVar3 == 0xfffffffffffffff3) || (uVar3 == 0xfffffffffffffff4)) {
    puVar1 = (undefined8 *)((o->it64 & 0x7fffffffffffU) + 0x20);
  }
  else {
    lVar4 = 0x23;
    if (0xfffffffffffffff2 < uVar3) {
      lVar4 = 0x15 - uVar3;
    }
    puVar1 = (undefined8 *)((L->glref).ptr64 + lVar4 * 8 + 0x1a8);
  }
  if (((GCtab *)*puVar1 != (GCtab *)0x0) &&
     (pcVar2 = lj_tab_getstr((GCtab *)*puVar1,*(GCstr **)((L->glref).ptr64 + 0x1a8 + (ulong)mm * 8))
     , pcVar2 != (cTValue *)0x0)) {
    return pcVar2;
  }
  return (cTValue *)((L->glref).ptr64 + 0xf8);
}

Assistant:

cTValue *lj_meta_lookup(lua_State *L, cTValue *o, MMS mm)
{
  GCtab *mt;
  if (tvistab(o))
    mt = tabref(tabV(o)->metatable);
  else if (tvisudata(o))
    mt = tabref(udataV(o)->metatable);
  else
    mt = tabref(basemt_obj(G(L), o));
  if (mt) {
    cTValue *mo = lj_tab_getstr(mt, mmname_str(G(L), mm));
    if (mo)
      return mo;
  }
  return niltv(L);
}